

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O1

void __thiscall
QMaxHeap<QTriangulator<unsigned_short>::ComplexToSimple::Intersection>::push
          (QMaxHeap<QTriangulator<unsigned_short>::ComplexToSimple::Intersection> *this,
          Intersection *x)

{
  qsizetype *pqVar1;
  quint64 *pqVar2;
  Intersection *pIVar3;
  long lVar4;
  uint uVar5;
  QPodPoint QVar6;
  quint64 qVar7;
  quint64 qVar8;
  quint64 qVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  bool bVar12;
  uint uVar13;
  ulong uVar14;
  Intersection *other;
  
  uVar14 = (this->m_data).siz;
  QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Intersection>::reserve
            (&this->m_data,uVar14 + 1);
  pIVar3 = (this->m_data).buffer;
  lVar4 = (this->m_data).siz;
  uVar11 = *(undefined4 *)&x->field_0x34;
  pIVar3[lVar4].rightEdge = x->rightEdge;
  *(undefined4 *)&pIVar3[lVar4].field_0x34 = uVar11;
  QVar6 = (x->intersectionPoint).upperLeft;
  qVar7 = (x->intersectionPoint).xOffset.numerator;
  qVar8 = (x->intersectionPoint).xOffset.denominator;
  qVar9 = (x->intersectionPoint).yOffset.numerator;
  uVar10 = *(undefined8 *)&x->vertex;
  pqVar2 = &pIVar3[lVar4].intersectionPoint.yOffset.denominator;
  *pqVar2 = (x->intersectionPoint).yOffset.denominator;
  pqVar2[1] = uVar10;
  pqVar2 = &pIVar3[lVar4].intersectionPoint.xOffset.denominator;
  *pqVar2 = qVar8;
  pqVar2[1] = qVar9;
  pIVar3[lVar4].intersectionPoint.upperLeft = QVar6;
  pIVar3[lVar4].intersectionPoint.xOffset.numerator = qVar7;
  pqVar1 = &(this->m_data).siz;
  *pqVar1 = *pqVar1 + 1;
  if ((int)uVar14 == 0) {
LAB_0044f9e6:
    uVar13 = (uint)uVar14;
  }
  else {
    do {
      uVar5 = (uint)uVar14;
      uVar13 = (int)((uVar5 - ((int)(uVar5 - 1) >> 0x1f)) + -1) >> 1;
      pIVar3 = (this->m_data).buffer;
      other = pIVar3 + (int)uVar13;
      bVar12 = QIntersectionPoint::operator<(&x->intersectionPoint,&other->intersectionPoint);
      if (!bVar12) goto LAB_0044f9e6;
      uVar11 = *(undefined4 *)&other->field_0x34;
      pIVar3[(int)uVar5].rightEdge = other->rightEdge;
      *(undefined4 *)&pIVar3[(int)uVar5].field_0x34 = uVar11;
      QVar6 = (other->intersectionPoint).upperLeft;
      qVar7 = (other->intersectionPoint).xOffset.numerator;
      qVar8 = (other->intersectionPoint).xOffset.denominator;
      qVar9 = (other->intersectionPoint).yOffset.numerator;
      uVar10 = *(undefined8 *)&other->vertex;
      pqVar2 = &pIVar3[(int)uVar5].intersectionPoint.yOffset.denominator;
      *pqVar2 = (other->intersectionPoint).yOffset.denominator;
      pqVar2[1] = uVar10;
      pqVar2 = &pIVar3[(int)uVar5].intersectionPoint.xOffset.denominator;
      *pqVar2 = qVar8;
      pqVar2[1] = qVar9;
      pIVar3[(int)uVar5].intersectionPoint.upperLeft = QVar6;
      pIVar3[(int)uVar5].intersectionPoint.xOffset.numerator = qVar7;
      uVar14 = (ulong)uVar13;
    } while (2 < uVar5);
  }
  pIVar3 = (this->m_data).buffer;
  uVar11 = *(undefined4 *)&x->field_0x34;
  pIVar3[(int)uVar13].rightEdge = x->rightEdge;
  *(undefined4 *)&pIVar3[(int)uVar13].field_0x34 = uVar11;
  QVar6 = (x->intersectionPoint).upperLeft;
  qVar7 = (x->intersectionPoint).xOffset.numerator;
  qVar8 = (x->intersectionPoint).xOffset.denominator;
  qVar9 = (x->intersectionPoint).yOffset.numerator;
  uVar10 = *(undefined8 *)&x->vertex;
  pqVar2 = &pIVar3[(int)uVar13].intersectionPoint.yOffset.denominator;
  *pqVar2 = (x->intersectionPoint).yOffset.denominator;
  pqVar2[1] = uVar10;
  pqVar2 = &pIVar3[(int)uVar13].intersectionPoint.xOffset.denominator;
  *pqVar2 = qVar8;
  pqVar2[1] = qVar9;
  pIVar3[(int)uVar13].intersectionPoint.upperLeft = QVar6;
  pIVar3[(int)uVar13].intersectionPoint.xOffset.numerator = qVar7;
  return;
}

Assistant:

void QMaxHeap<T>::push(const T &x)
{
    int current = m_data.size();
    int parent = QMaxHeap::parent(current);
    m_data.add(x);
    while (current != 0 && m_data.at(parent) < x) {
        m_data.at(current) = m_data.at(parent);
        current = parent;
        parent = QMaxHeap::parent(current);
    }
    m_data.at(current) = x;
}